

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O0

void Gia_ManBuiltInSimStart(Gia_Man_t *p,int nWords,int nObjs)

{
  int iVar1;
  int iVar2;
  Vec_Wrd_t *pVVar3;
  word Entry;
  int local_20;
  int local_1c;
  int k;
  int i;
  int nObjs_local;
  int nWords_local;
  Gia_Man_t *p_local;
  
  if (p->fBuiltInSim != 0) {
    __assert_fail("!p->fBuiltInSim",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                  ,0x30b,"void Gia_ManBuiltInSimStart(Gia_Man_t *, int, int)");
  }
  iVar1 = Gia_ManAndNum(p);
  if (iVar1 == 0) {
    p->fBuiltInSim = 1;
    p->iPatsPi = 0;
    p->iPastPiMax = 0;
    p->nSimWords = nWords;
    p->nSimWordsMax = 8;
    Gia_ManRandomW(1);
    iVar1 = p->nSimWords;
    iVar2 = Gia_ManCiNum(p);
    pVVar3 = Vec_WrdAlloc(iVar1 * iVar2);
    p->vSimsPi = pVVar3;
    pVVar3 = p->vSimsPi;
    iVar1 = p->nSimWords;
    iVar2 = Gia_ManCiNum(p);
    Vec_WrdFill(pVVar3,iVar1 * iVar2,0);
    pVVar3 = Vec_WrdAlloc(p->nSimWords * nObjs);
    p->vSims = pVVar3;
    Vec_WrdFill(p->vSims,p->nSimWords,0);
    local_1c = 0;
    while( true ) {
      iVar1 = Gia_ManCiNum(p);
      if (iVar1 <= local_1c) break;
      for (local_20 = 0; local_20 < p->nSimWords; local_20 = local_20 + 1) {
        pVVar3 = p->vSims;
        Entry = Gia_ManRandomW(0);
        Vec_WrdPush(pVVar3,Entry);
      }
      local_1c = local_1c + 1;
    }
    return;
  }
  __assert_fail("Gia_ManAndNum(p) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                ,0x30c,"void Gia_ManBuiltInSimStart(Gia_Man_t *, int, int)");
}

Assistant:

void Gia_ManBuiltInSimStart( Gia_Man_t * p, int nWords, int nObjs )
{
    int i, k;
    assert( !p->fBuiltInSim );
    assert( Gia_ManAndNum(p) == 0 );
    p->fBuiltInSim = 1;
    p->iPatsPi = 0;
    p->iPastPiMax = 0;
    p->nSimWords = nWords;
    p->nSimWordsMax = 8;
    Gia_ManRandomW( 1 );
    // init PI care info
    p->vSimsPi = Vec_WrdAlloc( p->nSimWords * Gia_ManCiNum(p) );
    Vec_WrdFill( p->vSimsPi, p->nSimWords * Gia_ManCiNum(p), 0 );
    // init object sim info
    p->vSims = Vec_WrdAlloc( p->nSimWords * nObjs );
    Vec_WrdFill( p->vSims, p->nSimWords, 0 );
    for ( i = 0; i < Gia_ManCiNum(p); i++ )
        for ( k = 0; k < p->nSimWords; k++ )
            Vec_WrdPush( p->vSims, Gia_ManRandomW(0) );
}